

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int __thiscall Polynomial::createPlusNode(Polynomial *this,int first_loc,int second_loc)

{
  int iVar1;
  int iVar2;
  initializer_list<int> __l;
  allocator_type local_51;
  operand local_50;
  vector<int,_std::allocator<int>_> args;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar1 = this->mNumStates;
  if (second_loc < iVar1 && first_loc < iVar1) {
    iVar2 = 0;
    if (iVar1 <= second_loc + first_loc) {
      iVar2 = iVar1;
    }
    second_loc = (second_loc + first_loc) - iVar2;
  }
  else if (first_loc != 0) {
    if (second_loc != 0) {
      __l._M_len = 2;
      __l._M_array = (iterator)&local_50;
      local_50.op = first_loc;
      local_50._4_4_ = second_loc;
      std::vector<int,_std::allocator<int>_>::vector(&args,__l,&local_51);
      local_50.op = PLUS;
      std::vector<int,_std::allocator<int>_>::vector(&local_50.args,&args);
      std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
      emplace_back<Polynomial::operand>(&this->mOperands,&local_50);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_50.args.super__Vector_base<int,_std::allocator<int>_>);
      local_50.op = PLUS;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->mEvaluationValues,(int *)&local_50);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&args.super__Vector_base<int,_std::allocator<int>_>);
      return this->mResultLocation;
    }
    this->mResultLocation = first_loc;
    return first_loc;
  }
  this->mResultLocation = second_loc;
  return second_loc;
}

Assistant:

int Polynomial::createPlusNode(int first_loc, int second_loc)
{
  mResultLocation = mEvaluationValues.size();
  if (isConstantLocation(first_loc) and isConstantLocation(second_loc))
    {
      // evaluate now, because they are constants
      int val = first_loc + second_loc;
      if (val >= mNumStates) val -= mNumStates;
      mResultLocation = val;
    }
  else if (first_loc == 0)
    mResultLocation = second_loc;
  else if (second_loc == 0)
    mResultLocation = first_loc;
  else
    {
      std::vector<int> args { first_loc, second_loc};
      mOperands.push_back({operandType::PLUS, args});
      mEvaluationValues.push_back(0); // make space in evaluation array for the output.
    }
  return mResultLocation;
}